

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  reference pbVar6;
  string local_1218 [32];
  undefined1 local_11f8 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1080 [32];
  undefined1 local_1060 [8];
  ostringstream cmCTestLog_msg_8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ee8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ee0;
  iterator i;
  string outname;
  string local_eb0 [4];
  int maxTestNameWidth;
  undefined1 local_e90 [8];
  ostringstream cmCTestLog_msg_7;
  string local_d18 [32];
  string local_cf8 [36];
  int local_cd4;
  undefined1 local_cd0 [8];
  ostringstream cmCTestLog_msg_6;
  ostringstream local_b58 [8];
  ostringstream indexStr;
  string local_9e0 [32];
  ostringstream local_9c0 [8];
  ostringstream cmCTestLog_msg_5;
  string local_848 [32];
  ostringstream local_828 [8];
  ostringstream cmCTestLog_msg_4;
  string local_6b0 [36];
  int local_68c;
  undefined1 local_688 [8];
  ostringstream cmCTestLog_msg_3;
  string local_510 [36];
  int local_4ec;
  undefined1 local_4e8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_370 [36];
  int local_34c;
  undefined1 local_348 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1d0 [52];
  int local_19c;
  undefined1 local_198 [8];
  ostringstream cmCTestLog_msg;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  if (this->NumberOfRunsLeft == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    iVar3 = getNumWidth(total);
    local_19c = (int)std::setw(iVar3);
    poVar4 = std::operator<<((ostream *)local_198,(_Setw)local_19c);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,completed);
    std::operator<<(poVar4,"/");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2d7,pcVar5,false);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
    iVar3 = getNumWidth(total);
    local_34c = (int)std::setw(iVar3);
    poVar4 = std::operator<<((ostream *)local_348,(_Setw)local_34c);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,total);
    std::operator<<(poVar4," ");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2d9,pcVar5,false);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
    iVar3 = getNumWidth(total);
    local_4ec = (int)std::setw(iVar3);
    poVar4 = std::operator<<((ostream *)local_4e8,(_Setw)local_4ec);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4," ");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e0,pcVar5,false);
    std::__cxx11::string::~string(local_510);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_688);
    iVar3 = getNumWidth(total);
    local_68c = (int)std::setw(iVar3);
    poVar4 = std::operator<<((ostream *)local_688,(_Setw)local_68c);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4," ");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e3,pcVar5,false);
    std::__cxx11::string::~string(local_6b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_688);
  }
  if ((this->TestHandler->MemCheck & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_9c0);
    std::operator<<((ostream *)local_9c0,"Test");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e9,pcVar5,false);
    std::__cxx11::string::~string(local_9e0);
    std::__cxx11::ostringstream::~ostringstream(local_9c0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_828);
    std::operator<<((ostream *)local_828,"MemCheck");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e7,pcVar5,false);
    std::__cxx11::string::~string(local_848);
    std::__cxx11::ostringstream::~ostringstream(local_828);
  }
  std::__cxx11::ostringstream::ostringstream(local_b58);
  poVar4 = std::operator<<((ostream *)local_b58," #");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->Index);
  std::operator<<(poVar4,":");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cd0);
  iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
  iVar3 = getNumWidth((long)iVar3);
  local_cd4 = (int)std::setw(iVar3 + 3);
  poVar4 = std::operator<<((ostream *)local_cd0,(_Setw)local_cd4);
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar4,local_cf8);
  std::__cxx11::string::~string(local_cf8);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2f0,pcVar5,false);
  std::__cxx11::string::~string(local_d18);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cd0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e90);
  std::operator<<((ostream *)local_e90," ");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2f1,pcVar5,false);
  std::__cxx11::string::~string(local_eb0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e90);
  iVar3 = cmCTest::GetMaxTestNameWidth(this->CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 &this->TestProperties->Name," ");
  std::__cxx11::string::resize((ulong)&i,(char)iVar3 + '\x04');
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestHandler->TotalNumberOfTests);
  poVar4 = std::operator<<(poVar4," Testing: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestHandler->TotalNumberOfTests);
  poVar4 = std::operator<<(poVar4," Test: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Command: \"");
  poVar4 = std::operator<<(poVar4,(string *)&this->ActualCommand);
  std::operator<<(poVar4,"\"");
  local_ee0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Arguments);
  while( true ) {
    local_ee8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Arguments);
    bVar2 = __gnu_cxx::operator!=(&local_ee0,&local_ee8);
    if (!bVar2) break;
    poVar4 = std::operator<<(this->TestHandler->LogFile," \"");
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_ee0);
    poVar4 = std::operator<<(poVar4,(string *)pbVar6);
    std::operator<<(poVar4,"\"");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_ee0);
  }
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (this->TestHandler->LogFile,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"Directory: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->TestProperties->Directory);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  poVar4 = std::operator<<(poVar4,"\" start time: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->StartTime);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Output:");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"----------------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(this->TestHandler->LogFile,(string *)&this->ProcessOutput);
  poVar4 = std::operator<<(poVar4,"<end of output>");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1060);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)local_1060,pcVar5);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x311,pcVar5,false);
  std::__cxx11::string::~string(local_1080);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1060);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11f8);
  poVar4 = std::operator<<((ostream *)local_11f8,"Testing ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::operator<<(poVar4," ... ");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x313,pcVar5,false);
  std::__cxx11::string::~string(local_1218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11f8);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::ostringstream::~ostringstream(local_b58);
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  // if this is the last or only run of this test
  // then print out completed / total
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  if (this->NumberOfRunsLeft == 1) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << completed << "/");
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << total << " ");
  }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << " "
                 << " ");
    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(getNumWidth(total))
                 << " "
                 << " ");
  }

  if (this->TestHandler->MemCheck) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "MemCheck");
  } else {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "Test");
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, " ");
  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Testing: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Test: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::vector<std::string>::iterator i = this->Arguments.begin();
       i != this->Arguments.end(); ++i) {
    *this->TestHandler->LogFile << " \"" << *i << "\"";
  }
  *this->TestHandler->LogFile
    << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name
    << "\" start time: " << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile << this->ProcessOutput << "<end of output>"
                              << std::endl;

  cmCTestLog(this->CTest, HANDLER_OUTPUT, outname.c_str());
  cmCTestLog(this->CTest, DEBUG, "Testing " << this->TestProperties->Name
                                            << " ... ");
}